

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_meth.c
# Opt level: O0

void * evp_kdf_new(void)

{
  void *ptr;
  CRYPTO_RWLOCK *pCVar1;
  size_t unaff_retaddr;
  EVP_KDF *kdf;
  char *in_stack_fffffffffffffff8;
  
  ptr = CRYPTO_zalloc(unaff_retaddr,in_stack_fffffffffffffff8,0);
  if (ptr != (void *)0x0) {
    pCVar1 = CRYPTO_THREAD_lock_new();
    *(CRYPTO_RWLOCK **)((long)ptr + 0x28) = pCVar1;
    if (pCVar1 != (CRYPTO_RWLOCK *)0x0) {
      LOCK();
      *(undefined4 *)((long)ptr + 0x20) = 1;
      UNLOCK();
      return ptr;
    }
  }
  CRYPTO_free(ptr);
  return (void *)0x0;
}

Assistant:

static void *evp_kdf_new(void)
{
    EVP_KDF *kdf = NULL;

    if ((kdf = OPENSSL_zalloc(sizeof(*kdf))) == NULL
        || (kdf->lock = CRYPTO_THREAD_lock_new()) == NULL) {
        OPENSSL_free(kdf);
        return NULL;
    }
    kdf->refcnt = 1;
    return kdf;
}